

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O3

satoko_t * satoko_create(void)

{
  uint uVar1;
  satoko_t *psVar2;
  vec_uint_t *pvVar3;
  cdb *pcVar4;
  uint *puVar5;
  vec_wl_t *pvVar6;
  watch_list *pwVar7;
  vec_act_t *pvVar8;
  heap_t *phVar9;
  vec_int_t *pvVar10;
  vec_char_t *pvVar11;
  b_queue_t *pbVar12;
  ulong uVar13;
  
  psVar2 = (satoko_t *)calloc(1,0x1e8);
  (psVar2->opts).f_rst = 0.8;
  (psVar2->opts).b_rst = 1.4;
  (psVar2->opts).fst_block_rst = 10000;
  (psVar2->opts).sz_lbd_bqueue = 0x32;
  (psVar2->opts).sz_trail_bqueue = 5000;
  (psVar2->opts).n_conf_fst_reduce = 2000;
  (psVar2->opts).inc_reduce = 300;
  (psVar2->opts).inc_special_reduce = 1000;
  (psVar2->opts).lbd_freeze_clause = 0x1e;
  (psVar2->opts).learnt_ratio = 0.5;
  (psVar2->opts).var_act_limit = 0x14c924d692ca61b;
  (psVar2->opts).var_act_rescale = 200;
  (psVar2->opts).var_decay = 0.95;
  (psVar2->opts).clause_max_sz_bin_resol = 0x1e;
  (psVar2->opts).clause_min_lbd_bin_resol = 6;
  (psVar2->opts).garbage_max_ratio = 0.3;
  psVar2->status = 1;
  pvVar3 = (vec_uint_t *)calloc(1,0x10);
  psVar2->assumptions = pvVar3;
  pvVar3 = (vec_uint_t *)calloc(1,0x10);
  psVar2->final_conflict = pvVar3;
  pcVar4 = (cdb *)calloc(1,0x18);
  pcVar4->cap = 0x110050;
  puVar5 = (uint *)malloc(0x440140);
  pcVar4->data = puVar5;
  psVar2->all_clauses = pcVar4;
  pvVar3 = (vec_uint_t *)calloc(1,0x10);
  psVar2->originals = pvVar3;
  pvVar3 = (vec_uint_t *)calloc(1,0x10);
  psVar2->learnts = pvVar3;
  pvVar6 = (vec_wl_t *)malloc(0x10);
  pvVar6->cap = 4;
  pvVar6->size = 0;
  pwVar7 = (watch_list *)calloc(0x60,0x18);
  pvVar6->watch_lists = pwVar7;
  psVar2->watches = pvVar6;
  psVar2->var_act_inc = 0x800000000000;
  psVar2->clause_act_inc = 0x800;
  pvVar8 = (vec_act_t *)calloc(1,0x10);
  psVar2->activity = pvVar8;
  phVar9 = (heap_t *)malloc(0x18);
  phVar9->weights = pvVar8;
  pvVar10 = (vec_int_t *)calloc(1,0x10);
  phVar9->indices = pvVar10;
  pvVar3 = (vec_uint_t *)calloc(1,0x10);
  phVar9->data = pvVar3;
  psVar2->var_order = phVar9;
  pvVar3 = (vec_uint_t *)calloc(1,0x10);
  psVar2->levels = pvVar3;
  pvVar3 = (vec_uint_t *)calloc(1,0x10);
  psVar2->reasons = pvVar3;
  pvVar11 = (vec_char_t *)calloc(1,0x10);
  psVar2->assigns = pvVar11;
  pvVar11 = (vec_char_t *)calloc(1,0x10);
  psVar2->polarity = pvVar11;
  pvVar3 = (vec_uint_t *)calloc(1,0x10);
  psVar2->trail = pvVar3;
  pvVar3 = (vec_uint_t *)calloc(1,0x10);
  psVar2->trail_lim = pvVar3;
  uVar1 = (psVar2->opts).sz_trail_bqueue;
  pbVar12 = (b_queue_t *)calloc(1,0x20);
  pbVar12->cap = uVar1;
  puVar5 = (uint *)calloc((ulong)uVar1,4);
  pbVar12->data = puVar5;
  psVar2->bq_trail = pbVar12;
  uVar1 = (psVar2->opts).sz_lbd_bqueue;
  pbVar12 = (b_queue_t *)calloc(1,0x20);
  pbVar12->cap = uVar1;
  puVar5 = (uint *)calloc((ulong)uVar1,4);
  pbVar12->data = puVar5;
  psVar2->bq_lbd = pbVar12;
  uVar13 = (ulong)(psVar2->opts).n_conf_fst_reduce;
  psVar2->n_confl_bfr_reduce = uVar13;
  psVar2->RC1 = 1;
  psVar2->RC2 = uVar13;
  pvVar3 = (vec_uint_t *)calloc(1,0x10);
  psVar2->temp_lits = pvVar3;
  pvVar11 = (vec_char_t *)calloc(1,0x10);
  psVar2->seen = pvVar11;
  pvVar3 = (vec_uint_t *)calloc(1,0x10);
  psVar2->tagged = pvVar3;
  pvVar3 = (vec_uint_t *)calloc(1,0x10);
  psVar2->stack = pvVar3;
  pvVar3 = (vec_uint_t *)calloc(1,0x10);
  psVar2->last_dlevel = pvVar3;
  pvVar3 = (vec_uint_t *)calloc(1,0x10);
  psVar2->stamps = pvVar3;
  return psVar2;
}

Assistant:

solver_t * satoko_create()
{
    solver_t *s = satoko_calloc(solver_t, 1);

    satoko_default_opts(&s->opts);
    s->status = SATOKO_OK;
    /* User data */
    s->assumptions = vec_uint_alloc(0);
    s->final_conflict = vec_uint_alloc(0);
    /* Clauses Database */
    s->all_clauses = cdb_alloc(0);
    s->originals = vec_uint_alloc(0);
    s->learnts = vec_uint_alloc(0);
    s->watches = vec_wl_alloc(0);
    /* Activity heuristic */
    s->var_act_inc = VAR_ACT_INIT_INC;
    s->clause_act_inc = CLAUSE_ACT_INIT_INC;
    /* Variable Information */
    s->activity = vec_act_alloc(0);
    s->var_order = heap_alloc(s->activity);
    s->levels = vec_uint_alloc(0);
    s->reasons = vec_uint_alloc(0);
    s->assigns = vec_char_alloc(0);
    s->polarity = vec_char_alloc(0);
    /* Assignments */
    s->trail = vec_uint_alloc(0);
    s->trail_lim = vec_uint_alloc(0);
    /* Temporary data used by Search method */
    s->bq_trail = b_queue_alloc(s->opts.sz_trail_bqueue);
    s->bq_lbd = b_queue_alloc(s->opts.sz_lbd_bqueue);
    s->n_confl_bfr_reduce = s->opts.n_conf_fst_reduce;
    s->RC1 = 1;
    s->RC2 = s->opts.n_conf_fst_reduce;
    /* Temporary data used by Analyze */
    s->temp_lits = vec_uint_alloc(0);
    s->seen = vec_char_alloc(0);
    s->tagged = vec_uint_alloc(0);
    s->stack = vec_uint_alloc(0);
    s->last_dlevel = vec_uint_alloc(0);
    /* Misc temporary */
    s->stamps = vec_uint_alloc(0);
    return s;
}